

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t archive_read_format_tar_bid(archive_read *a,wchar_t best_bid)

{
  byte bVar1;
  wchar_t wVar2;
  int iVar3;
  int iVar4;
  archive_read *a_00;
  wchar_t wVar5;
  void *pvVar6;
  int iVar7;
  wchar_t wVar8;
  
  pvVar6 = (void *)0x200;
  a_00 = (archive_read *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  if (a_00 == (archive_read *)0x0) {
    wVar8 = L'\xffffffff';
  }
  else if (((char)(a_00->archive).magic == '\0') &&
          (wVar8 = archive_block_is_null((char *)a_00), wVar8 != L'\0')) {
    wVar8 = L'\n';
  }
  else {
    wVar2 = checksum(a_00,pvVar6);
    wVar5 = L'\0';
    wVar8 = L'\0';
    if (wVar2 != L'\0') {
      pvVar6 = (void *)((long)&a_00->bidders[0].name + 1);
      iVar3 = bcmp(pvVar6,"ustar",6);
      if (iVar3 == 0) {
        iVar3 = 0x30;
        if (*(short *)((long)&a_00->bidders[0].name + 7) == 0x3030) {
          iVar3 = 0x68;
        }
      }
      else {
        iVar3 = 0x30;
      }
      iVar4 = bcmp(pvVar6,"ustar ",6);
      iVar7 = iVar3;
      if ((iVar4 == 0) &&
         (iVar7 = iVar3 + 0x38, *(short *)((long)&a_00->bidders[0].name + 7) != 0x20)) {
        iVar7 = iVar3;
      }
      bVar1 = a_00->field_0x9c;
      if (((((((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0)) || ((byte)(bVar1 - 0x30) < 10)
            ) && ((wVar2 = validate_number_field
                                     ((char *)((long)&(a_00->archive).read_data_block + 4),8),
                  wVar8 = wVar5, wVar2 != L'\0' &&
                  (wVar2 = validate_number_field
                                     ((char *)((long)&(a_00->archive).read_data_offset + 4),8),
                  wVar2 != L'\0')))) &&
          ((wVar2 = validate_number_field
                              ((char *)((long)&(a_00->archive).read_data_output_offset + 4),8),
           wVar2 != L'\0' &&
           ((wVar2 = validate_number_field((char *)&(a_00->archive).read_data_requested,0xc),
            wVar2 != L'\0' &&
            (wVar2 = validate_number_field
                               ((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc),
            wVar2 != L'\0')))))) &&
         ((wVar2 = validate_number_field((char *)((long)&a_00->bidders[3].name + 1),8),
          wVar2 != L'\0' &&
          (wVar2 = validate_number_field((char *)((long)&a_00->bidders[3].vtable + 1),8),
          wVar2 != L'\0')))) {
        wVar8 = iVar7 + L'\x02';
      }
    }
  }
  return wVar8;
}

Assistant:

static int
archive_read_format_tar_bid(struct archive_read *a, int best_bid)
{
	int bid;
	const char *h;
	const struct archive_entry_header_ustar *header;

	(void)best_bid; /* UNUSED */

	bid = 0;

	/* Now let's look at the actual header and see if it matches. */
	h = __archive_read_ahead(a, 512, NULL);
	if (h == NULL)
		return (-1);

	/* If it's an end-of-archive mark, we can handle it. */
	if (h[0] == 0 && archive_block_is_null(h)) {
		/*
		 * Usually, I bid the number of bits verified, but
		 * in this case, 4096 seems excessive so I picked 10 as
		 * an arbitrary but reasonable-seeming value.
		 */
		return (10);
	}

	/* If it's not an end-of-archive mark, it must have a valid checksum.*/
	if (!checksum(a, h))
		return (0);
	bid += 48;  /* Checksum is usually 6 octal digits. */

	header = (const struct archive_entry_header_ustar *)h;

	/* Recognize POSIX formats. */
	if ((memcmp(header->magic, "ustar\0", 6) == 0)
	    && (memcmp(header->version, "00", 2) == 0))
		bid += 56;

	/* Recognize GNU tar format. */
	if ((memcmp(header->magic, "ustar ", 6) == 0)
	    && (memcmp(header->version, " \0", 2) == 0))
		bid += 56;

	/* Type flag must be null, digit or A-Z, a-z. */
	if (header->typeflag[0] != 0 &&
	    !( header->typeflag[0] >= '0' && header->typeflag[0] <= '9') &&
	    !( header->typeflag[0] >= 'A' && header->typeflag[0] <= 'Z') &&
	    !( header->typeflag[0] >= 'a' && header->typeflag[0] <= 'z') )
		return (0);
	bid += 2;  /* 6 bits of variation in an 8-bit field leaves 2 bits. */

	/*
	 * Check format of mode/uid/gid/mtime/size/rdevmajor/rdevminor fields.
	 */
	if (bid > 0 && (
	    validate_number_field(header->mode, sizeof(header->mode)) == 0
	    || validate_number_field(header->uid, sizeof(header->uid)) == 0
	    || validate_number_field(header->gid, sizeof(header->gid)) == 0
	    || validate_number_field(header->mtime, sizeof(header->mtime)) == 0
	    || validate_number_field(header->size, sizeof(header->size)) == 0
	    || validate_number_field(header->rdevmajor, sizeof(header->rdevmajor)) == 0
	    || validate_number_field(header->rdevminor, sizeof(header->rdevminor)) == 0)) {
		bid = 0;
	}

	return (bid);
}